

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O3

unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> * __thiscall
optimization::const_merge::Env::get_inst(Env *this,pair<int,_int> pair)

{
  pointer puVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  pair<int,_int> local_10;
  
  local_10 = pair;
  pmVar2 = std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::at(&this->func->basic_blks,&local_10.first);
  puVar1 = (pmVar2->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)local_10.second <
      (ulong)((long)(pmVar2->inst).
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return puVar1 + local_10.second;
  }
  pcVar3 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  (((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)pcVar3)->_M_t).
  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)((long)pcVar3 + 0x10);
  std::__cxx11::string::_M_construct<char*>();
  return (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)pcVar3;
}

Assistant:

std::unique_ptr<mir::inst::Inst>& get_inst(
      std::pair<mir::types::LabelId, int> pair) {
    return func.basic_blks.at(pair.first).inst.at(pair.second);
  }